

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.h
# Opt level: O2

QString * __thiscall
MakefileGenerator::
escapeDependencyPath<QStringBuilder<QStringBuilder<QStringBuilder<ProString&,ProString>,ProString_const&>,char>,ProString>
          (QString *__return_storage_ptr__,MakefileGenerator *this,
          QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString_&,_ProString>,_const_ProString_&>,_char>,_ProString>
          *path)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString_&,_ProString>,_const_ProString_&>,_char>,_ProString>
  ::convertTo<QString>((QString *)&QStack_38,path);
  (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xd])
            (__return_storage_ptr__,this,&QStack_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString escapeDependencyPath(const QStringBuilder<A, B> &path) const
    { return escapeDependencyPath(QString(path)); }